

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderImageLoadStoreTests.cpp
# Opt level: O1

long __thiscall gl4cts::anon_unknown_0::BasicAllTargetsLoadMS::Run(BasicAllTargetsLoadMS *this)

{
  CallLogWrapper *pCVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  BasicAllTargetsLoadMS *pBVar3;
  bool bVar4;
  bool bVar5;
  GLuint GVar6;
  GLint GVar7;
  ostream *poVar8;
  undefined7 extraout_var;
  size_t sVar9;
  undefined7 extraout_var_00;
  undefined7 extraout_var_01;
  long lVar10;
  byte bVar11;
  int in_ESI;
  int iVar12;
  GLenum GVar13;
  vec4 *pvVar14;
  char *pcVar15;
  GLuint GVar16;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  local_418;
  Vector<float,_4> local_3f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_3e0;
  size_type local_3d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3d0;
  undefined4 local_3bc;
  CallLogWrapper *local_3b8;
  BasicAllTargetsLoadMS *local_3b0;
  GLint uniforms;
  undefined8 local_3a0;
  char local_398;
  undefined1 uStack_397;
  undefined6 uStack_396;
  GLchar name [32];
  GLuint textures [2];
  undefined1 local_350;
  undefined1 uStack_34f;
  undefined6 uStack_34e;
  GLuint fbo;
  undefined8 local_338;
  char local_330;
  undefined1 uStack_32f;
  undefined6 uStack_32e;
  GLenum draw_buffers [3];
  undefined4 uStack_314;
  char local_310;
  undefined1 uStack_30f;
  undefined6 uStack_30e;
  char *local_300;
  undefined8 local_2f8;
  char local_2f0;
  undefined1 uStack_2ef;
  undefined6 uStack_2ee;
  char *local_2e0;
  undefined8 local_2d8;
  char local_2d0;
  undefined1 uStack_2cf;
  undefined6 uStack_2ce;
  char *local_2c0;
  undefined8 local_2b8;
  char local_2b0;
  undefined1 uStack_2af;
  undefined6 uStack_2ae;
  char *local_2a0;
  undefined8 local_298;
  char local_290;
  undefined1 uStack_28f;
  undefined6 uStack_28e;
  char *local_280;
  undefined8 local_278;
  char local_270;
  undefined1 uStack_26f;
  undefined6 uStack_26e;
  char *local_260;
  undefined8 local_258;
  char local_250;
  undefined1 uStack_24f;
  undefined6 uStack_24e;
  char *local_240;
  undefined8 local_238;
  char local_230;
  undefined1 uStack_22f;
  undefined6 uStack_22e;
  char *local_220;
  undefined8 local_218;
  char local_210;
  undefined1 uStack_20f;
  undefined6 uStack_20e;
  char *local_200;
  undefined8 local_1f8;
  char local_1f0;
  undefined1 uStack_1ef;
  undefined6 uStack_1ee;
  long *local_1e0;
  long local_1d0 [2];
  GLfloat local_1bc [2];
  DataType aDStack_1b4 [2];
  GLint isamples;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  name_index_map;
  ios_base local_138 [264];
  
  bVar4 = ShaderImageLoadStoreBase::SupportedSamples(&this->super_ShaderImageLoadStoreBase,in_ESI);
  lVar10 = 0x10;
  if (bVar4) {
    local_3b0 = this;
    ShaderImageLoadStoreBase::CreateFullViewportQuad
              (&this->super_ShaderImageLoadStoreBase,&this->m_vao,&this->m_vbo,(GLuint *)0x0);
    local_1bc[0] = -1.0;
    local_1bc[1] = 10.0;
    aDStack_1b4[0] = 0xc3480000;
    aDStack_1b4[1] = 0x453b8000;
    local_3f0.m_data[0] = -1.0;
    local_3f0.m_data[1] = 10.0;
    local_3f0.m_data[2] = -200.0;
    local_3f0.m_data[3] = 3000.0;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&name_index_map);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&name_index_map,
               "#version 420 core\nlayout(location = 0) out vec4 o_color;\nlayout(",0x40);
    local_418.first._M_dataplus._M_p = (pointer)&local_418.first.field_2;
    local_418.first._M_string_length = 7;
    local_418.first.field_2._M_allocated_capacity = 0x66323361626772;
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&name_index_map,local_418.first._M_dataplus._M_p,7);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,") readonly uniform ",0x13);
    pcVar15 = name + 0x10;
    name[8] = '\0';
    name[9] = '\0';
    name[10] = '\0';
    name[0xb] = '\0';
    name[0xc] = '\0';
    name[0xd] = '\0';
    name[0xe] = '\0';
    name[0xf] = '\0';
    name[0x10] = '\0';
    name._0_8_ = pcVar15;
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>(poVar8,pcVar15,0);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar8,"image2DMS g_image_2dms;\nlayout(",0x1f);
    local_3d8 = 7;
    local_3d0._M_allocated_capacity = 0x66323361626772;
    local_3e0 = &local_3d0;
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>(poVar8,local_3d0._M_local_buf,7);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,") readonly uniform ",0x13);
    draw_buffers._0_8_ = &local_310;
    stack0xfffffffffffffce8 = 0;
    local_310 = '\0';
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>(poVar8,(char *)draw_buffers._0_8_,0)
    ;
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar8,
               "image2DMSArray g_image_2dms_array;\nvoid main() {\n  o_color = vec4(0.0, 1.0, 0.0, 1.0);\n  ivec2 coord = ivec2(gl_FragCoord.xy);\n  if (imageLoad(g_image_2dms, coord, 0) != "
               ,0xaa);
    textures = (GLuint  [2])&local_350;
    local_350 = 0;
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>(poVar8,(char *)textures,0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"vec4",4);
    poVar8 = tcu::operator<<(poVar8,&local_3f0);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar8,
               ") o_color = vec4(1.0, 0.0, 0.0, 0.1);\n  if (imageLoad(g_image_2dms, coord, 1) != ",
               0x51);
    _fbo = &local_330;
    local_338 = 0;
    local_330 = '\0';
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>(poVar8,_fbo,0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"vec4",4);
    poVar8 = tcu::operator<<(poVar8,&local_3f0);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar8,
               ") o_color = vec4(1.0, 0.0, 0.0, 0.1);\n  if (imageLoad(g_image_2dms, coord, 2) != ",
               0x51);
    _uniforms = &local_398;
    local_3a0 = 0;
    local_398 = '\0';
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>(poVar8,_uniforms,0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"vec4",4);
    poVar8 = tcu::operator<<(poVar8,&local_3f0);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar8,
               ") o_color = vec4(1.0, 0.0, 0.0, 0.1);\n  if (imageLoad(g_image_2dms, coord, 3) != ",
               0x51);
    local_200 = &local_1f0;
    local_1f8 = 0;
    local_1f0 = '\0';
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>(poVar8,local_200,0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"vec4",4);
    poVar8 = tcu::operator<<(poVar8,&local_3f0);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar8,
               ") o_color = vec4(1.0, 0.0, 0.0, 0.1);\n  if (imageLoad(g_image_2dms_array, ivec3(coord, 0), 0) != "
               ,0x61);
    local_220 = &local_210;
    local_218 = 0;
    local_210 = '\0';
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>(poVar8,local_220,0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"vec4",4);
    poVar8 = tcu::operator<<(poVar8,&local_3f0);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar8,
               ") o_color = vec4(1.0, 0.0, 0.0, 0.2);\n  if (imageLoad(g_image_2dms_array, ivec3(coord, 0), 1) != "
               ,0x61);
    local_240 = &local_230;
    local_238 = 0;
    local_230 = '\0';
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>(poVar8,local_240,0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"vec4",4);
    poVar8 = tcu::operator<<(poVar8,&local_3f0);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar8,
               ") o_color = vec4(1.0, 0.0, 0.0, 0.2);\n  if (imageLoad(g_image_2dms_array, ivec3(coord, 0), 2) != "
               ,0x61);
    local_260 = &local_250;
    local_258 = 0;
    local_250 = '\0';
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>(poVar8,local_260,0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"vec4",4);
    poVar8 = tcu::operator<<(poVar8,&local_3f0);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar8,
               ") o_color = vec4(1.0, 0.0, 0.0, 0.2);\n  if (imageLoad(g_image_2dms_array, ivec3(coord, 0), 3) != "
               ,0x61);
    local_280 = &local_270;
    local_278 = 0;
    local_270 = '\0';
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>(poVar8,local_280,0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"vec4",4);
    poVar8 = tcu::operator<<(poVar8,&local_3f0);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar8,
               ") o_color = vec4(1.0, 0.0, 0.0, 0.2);\n  if (imageLoad(g_image_2dms_array, ivec3(coord, 1), 0) != "
               ,0x61);
    local_2a0 = &local_290;
    local_298 = 0;
    local_290 = '\0';
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>(poVar8,local_2a0,0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"vec4",4);
    poVar8 = tcu::operator<<(poVar8,&local_3f0);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar8,
               ") o_color = vec4(1.0, 0.0, 0.0, 0.3);\n  if (imageLoad(g_image_2dms_array, ivec3(coord, 1), 1) != "
               ,0x61);
    local_2c0 = &local_2b0;
    local_2b8 = 0;
    local_2b0 = '\0';
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>(poVar8,local_2c0,0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"vec4",4);
    poVar8 = tcu::operator<<(poVar8,&local_3f0);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar8,
               ") o_color = vec4(1.0, 0.0, 0.0, 0.3);\n  if (imageLoad(g_image_2dms_array, ivec3(coord, 1), 2) != "
               ,0x61);
    local_2e0 = &local_2d0;
    local_2d8 = 0;
    local_2d0 = '\0';
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>(poVar8,local_2e0,0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"vec4",4);
    poVar8 = tcu::operator<<(poVar8,&local_3f0);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar8,
               ") o_color = vec4(1.0, 0.0, 0.0, 0.3);\n  if (imageLoad(g_image_2dms_array, ivec3(coord, 1), 3) != "
               ,0x61);
    local_300 = &local_2f0;
    local_2f8 = 0;
    local_2f0 = '\0';
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>(poVar8,local_300,0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"vec4",4);
    poVar8 = tcu::operator<<(poVar8,&local_3f0);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar8,") o_color = vec4(1.0, 0.0, 0.0, 0.3);\n}",0x27);
    if (local_300 != &local_2f0) {
      operator_delete(local_300,CONCAT62(uStack_2ee,CONCAT11(uStack_2ef,local_2f0)) + 1);
    }
    if (local_2e0 != &local_2d0) {
      operator_delete(local_2e0,CONCAT62(uStack_2ce,CONCAT11(uStack_2cf,local_2d0)) + 1);
    }
    if (local_2c0 != &local_2b0) {
      operator_delete(local_2c0,CONCAT62(uStack_2ae,CONCAT11(uStack_2af,local_2b0)) + 1);
    }
    if (local_2a0 != &local_290) {
      operator_delete(local_2a0,CONCAT62(uStack_28e,CONCAT11(uStack_28f,local_290)) + 1);
    }
    if (local_280 != &local_270) {
      operator_delete(local_280,CONCAT62(uStack_26e,CONCAT11(uStack_26f,local_270)) + 1);
    }
    if (local_260 != &local_250) {
      operator_delete(local_260,CONCAT62(uStack_24e,CONCAT11(uStack_24f,local_250)) + 1);
    }
    if (local_240 != &local_230) {
      operator_delete(local_240,CONCAT62(uStack_22e,CONCAT11(uStack_22f,local_230)) + 1);
    }
    if (local_220 != &local_210) {
      operator_delete(local_220,CONCAT62(uStack_20e,CONCAT11(uStack_20f,local_210)) + 1);
    }
    if (local_200 != &local_1f0) {
      operator_delete(local_200,CONCAT62(uStack_1ee,CONCAT11(uStack_1ef,local_1f0)) + 1);
    }
    if (_uniforms != &local_398) {
      operator_delete(_uniforms,CONCAT62(uStack_396,CONCAT11(uStack_397,local_398)) + 1);
    }
    if (_fbo != &local_330) {
      operator_delete(_fbo,CONCAT62(uStack_32e,CONCAT11(uStack_32f,local_330)) + 1);
    }
    if (textures != (GLuint  [2])&local_350) {
      operator_delete((void *)textures,CONCAT62(uStack_34e,CONCAT11(uStack_34f,local_350)) + 1);
    }
    if ((char *)draw_buffers._0_8_ != &local_310) {
      operator_delete((void *)draw_buffers._0_8_,
                      CONCAT62(uStack_30e,CONCAT11(uStack_30f,local_310)) + 1);
    }
    if (local_3e0 != &local_3d0) {
      operator_delete(local_3e0,local_3d0._M_allocated_capacity + 1);
    }
    if ((char *)name._0_8_ != pcVar15) {
      operator_delete((void *)name._0_8_,CONCAT62(name._18_6_,CONCAT11(name[0x11],name[0x10])) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_418.first._M_dataplus._M_p != &local_418.first.field_2) {
      operator_delete(local_418.first._M_dataplus._M_p,
                      local_418.first.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&name_index_map);
    std::ios_base::~ios_base(local_138);
    pBVar3 = local_3b0;
    GVar6 = ShaderImageLoadStoreBase::BuildProgram
                      (&local_3b0->super_ShaderImageLoadStoreBase,
                       "#version 420 core\nlayout(location = 0) in vec4 i_position;\nvoid main() {\n  gl_Position = i_position;\n}"
                       ,(char *)0x0,(char *)0x0,(char *)0x0,(char *)local_1e0,(bool *)0x0);
    if (local_1e0 != local_1d0) {
      operator_delete(local_1e0,local_1d0[0] + 1);
    }
    pCVar1 = &(pBVar3->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper;
    glu::CallLogWrapper::glGenTextures(pCVar1,2,textures);
    glu::CallLogWrapper::glBindTexture(pCVar1,0x9100,textures[0]);
    glu::CallLogWrapper::glTexImage2DMultisample(pCVar1,0x9100,4,0x8814,0x10,0x10,'\0');
    glu::CallLogWrapper::glBindTexture(pCVar1,0x9100,0);
    glu::CallLogWrapper::glBindTexture(pCVar1,0x9102,textures[1]);
    glu::CallLogWrapper::glTexImage3DMultisample(pCVar1,0x9102,4,0x8814,0x10,0x10,2,'\0');
    glu::CallLogWrapper::glBindTexture(pCVar1,0x9102,0);
    glu::CallLogWrapper::glGenFramebuffers(pCVar1,1,&fbo);
    glu::CallLogWrapper::glBindFramebuffer(pCVar1,0x8d40,fbo);
    glu::CallLogWrapper::glFramebufferTexture2D(pCVar1,0x8d40,0x8ce0,0x9100,textures[0],0);
    glu::CallLogWrapper::glFramebufferTextureLayer(pCVar1,0x8d40,0x8ce1,textures[1],0,0);
    glu::CallLogWrapper::glFramebufferTextureLayer(pCVar1,0x8d40,0x8ce2,textures[1],0,1);
    draw_buffers[0] = 0x8ce0;
    draw_buffers[1] = 0x8ce1;
    stack0xfffffffffffffce8 = CONCAT44(uStack_314,0x8ce2);
    glu::CallLogWrapper::glDrawBuffers(pCVar1,3,draw_buffers);
    glu::CallLogWrapper::glClearBufferfv(pCVar1,0x1800,0,local_1bc);
    glu::CallLogWrapper::glClearBufferfv(pCVar1,0x1800,1,local_1bc);
    glu::CallLogWrapper::glClearBufferfv(pCVar1,0x1800,2,local_1bc);
    glu::CallLogWrapper::glDeleteFramebuffers(pCVar1,1,&fbo);
    glu::CallLogWrapper::glBindImageTexture(pCVar1,1,textures[0],0,'\0',0,35000,0x8814);
    pvVar14 = (vec4 *)0x0;
    glu::CallLogWrapper::glBindImageTexture(pCVar1,4,textures[1],0,'\x01',0,35000,0x8814);
    glu::CallLogWrapper::glUseProgram(pCVar1,GVar6);
    GVar7 = glu::CallLogWrapper::glGetUniformLocation(pCVar1,GVar6,"g_image_2dms");
    glu::CallLogWrapper::glUniform1i(pCVar1,GVar7,1);
    GVar7 = glu::CallLogWrapper::glGetUniformLocation(pCVar1,GVar6,"g_image_2dms_array");
    glu::CallLogWrapper::glUniform1i(pCVar1,GVar7,4);
    glu::CallLogWrapper::glClear(pCVar1,0x4000);
    glu::CallLogWrapper::glBindVertexArray(pCVar1,pBVar3->m_vao);
    iVar12 = 0x10;
    glu::CallLogWrapper::glViewport(pCVar1,0,0,0x10,0x10);
    glu::CallLogWrapper::glDrawArrays(pCVar1,5,0,4);
    name_index_map._M_t._M_impl._0_8_ = 0x3f80000000000000;
    name_index_map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    name_index_map._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0x3f800000;
    bVar4 = ShaderImageLoadStoreBase::ValidateReadBuffer
                      (&pBVar3->super_ShaderImageLoadStoreBase,0x10,0x10,(int)&name_index_map,iVar12
                       ,pvVar14);
    GVar13 = (GLenum)pvVar14;
    local_3bc = (undefined4)CONCAT71(extraout_var,bVar4);
    name_index_map._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
         name_index_map._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffff00000000;
    name_index_map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    name_index_map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &name_index_map._M_t._M_impl.super__Rb_tree_header._M_header;
    name_index_map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_3b8 = pCVar1;
    name_index_map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         name_index_map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    glu::CallLogWrapper::glGetProgramiv(pCVar1,GVar6,0x8b86,&uniforms);
    if (uniforms != 2) {
      local_3bc = 0;
      anon_unknown_0::Output("ACTIVE_UNIFORMS is %d should be 2.\n");
    }
    if (uniforms != 0) {
      GVar16 = 0;
      do {
        pcVar15 = name;
        glu::CallLogWrapper::glGetActiveUniformName(local_3b8,GVar6,GVar16,0x20,(GLsizei *)0x0,name)
        ;
        GVar13 = (GLenum)pcVar15;
        local_3e0 = &local_3d0;
        sVar9 = strlen(name);
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_3e0,name,name + sVar9);
        local_418.first._M_dataplus._M_p = (pointer)&local_418.first.field_2;
        if (local_3e0 == &local_3d0) {
          local_418.first.field_2._8_8_ = CONCAT71(local_3d0._9_7_,local_3d0._M_local_buf[8]);
        }
        else {
          local_418.first._M_dataplus._M_p = (pointer)local_3e0;
        }
        local_418.first.field_2._M_allocated_capacity = local_3d0._M_allocated_capacity;
        local_418.first._M_string_length = local_3d8;
        local_3d8 = 0;
        local_3d0._M_allocated_capacity = local_3d0._M_allocated_capacity & 0xffffffffffffff00;
        local_418.second = GVar16;
        local_3e0 = &local_3d0;
        std::
        _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_int>,std::_Select1st<std::pair<std::__cxx11::string_const,unsigned_int>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_int>>>
        ::_M_emplace_unique<std::pair<std::__cxx11::string,unsigned_int>>
                  ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_int>,std::_Select1st<std::pair<std::__cxx11::string_const,unsigned_int>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_int>>>
                    *)&name_index_map,&local_418);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_418.first._M_dataplus._M_p != &local_418.first.field_2) {
          operator_delete(local_418.first._M_dataplus._M_p,
                          local_418.first.field_2._M_allocated_capacity + 1);
        }
        if (local_3e0 != &local_3d0) {
          operator_delete(local_3e0,local_3d0._M_allocated_capacity + 1);
        }
        GVar16 = GVar16 + 1;
      } while (GVar16 < (uint)uniforms);
    }
    paVar2 = &local_418.first.field_2;
    local_418.first.field_2._M_allocated_capacity = 0x5f6567616d695f67;
    local_418.first._M_string_length = 0xc;
    local_418.first.field_2._8_5_ = 0x736d6432;
    local_418.first._M_dataplus._M_p = (pointer)paVar2;
    bVar4 = ShaderImageLoadStoreBase::CheckUniform
                      (&local_3b0->super_ShaderImageLoadStoreBase,GVar6,&local_418.first,
                       &name_index_map,0x9055,GVar13);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_418.first._M_dataplus._M_p != paVar2) {
      operator_delete(local_418.first._M_dataplus._M_p,
                      local_418.first.field_2._M_allocated_capacity + 1);
    }
    local_418.first._M_dataplus._M_p = (pointer)&local_418.first.field_2;
    name[0] = '\x12';
    name[1] = '\0';
    name[2] = '\0';
    name[3] = '\0';
    name[4] = '\0';
    name[5] = '\0';
    name[6] = '\0';
    name[7] = '\0';
    local_418.first._M_dataplus._M_p =
         (pointer)std::__cxx11::string::_M_create((ulong *)&local_418,(ulong)name);
    local_418.first.field_2._M_local_buf[0] = name[0];
    local_418.first.field_2._M_local_buf[1] = name[1];
    local_418.first.field_2._M_local_buf[2] = name[2];
    local_418.first.field_2._M_local_buf[3] = name[3];
    local_418.first.field_2._M_local_buf[4] = name[4];
    local_418.first.field_2._M_local_buf[5] = name[5];
    local_418.first.field_2._M_local_buf[6] = name[6];
    local_418.first.field_2._M_local_buf[7] = name[7];
    builtin_strncpy(local_418.first._M_dataplus._M_p,"g_image_2dms_array",0x12);
    local_418.first._M_string_length._0_1_ = name[0];
    local_418.first._M_string_length._1_1_ = name[1];
    local_418.first._M_string_length._2_1_ = name[2];
    local_418.first._M_string_length._3_1_ = name[3];
    local_418.first._M_string_length._4_1_ = name[4];
    local_418.first._M_string_length._5_1_ = name[5];
    local_418.first._M_string_length._6_1_ = name[6];
    local_418.first._M_string_length._7_1_ = name[7];
    local_418.first._M_dataplus._M_p[name._0_8_] = '\0';
    bVar5 = ShaderImageLoadStoreBase::CheckUniform
                      (&local_3b0->super_ShaderImageLoadStoreBase,GVar6,&local_418.first,
                       &name_index_map,0x9056,GVar13);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_418.first._M_dataplus._M_p != &local_418.first.field_2) {
      operator_delete(local_418.first._M_dataplus._M_p,
                      local_418.first.field_2._M_allocated_capacity + 1);
    }
    glu::CallLogWrapper::glDeleteTextures(local_3b8,2,textures);
    glu::CallLogWrapper::glUseProgram(local_3b8,0);
    glu::CallLogWrapper::glDeleteProgram(local_3b8,GVar6);
    bVar11 = (byte)local_3bc;
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
    ::~_Rb_tree(&name_index_map._M_t);
    lVar10 = -1;
    if ((bVar11 & bVar4 & bVar5) == 1) {
      glu::CallLogWrapper::glGetIntegerv(local_3b8,0x9110,&isamples);
      if (3 < isamples) {
        local_1bc[0] = 1.4013e-45;
        local_1bc[1] = -NAN;
        aDStack_1b4[0] = TYPE_FLOAT_VEC3;
        aDStack_1b4[1] = ~TYPE_FLOAT_VEC3;
        local_3f0.m_data[0] = 1.4013e-45;
        local_3f0.m_data[1] = -NAN;
        local_3f0.m_data[2] = 4.2039e-45;
        local_3f0.m_data[3] = -NAN;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&name_index_map);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&name_index_map,
                   "#version 420 core\nlayout(location = 0) out vec4 o_color;\nlayout(",0x40);
        pcVar15 = name + 0x10;
        local_418.first._M_dataplus._M_p = (pointer)&local_418.first.field_2;
        local_418.first._M_string_length = 7;
        local_418.first.field_2._M_allocated_capacity = 0x69323361626772;
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&name_index_map,local_418.first._M_dataplus._M_p,7);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,") readonly uniform ",0x13);
        name[0x10] = 'i';
        name[0x11] = '\0';
        name[8] = '\x01';
        name[9] = '\0';
        name[10] = '\0';
        name[0xb] = '\0';
        name[0xc] = '\0';
        name[0xd] = '\0';
        name[0xe] = '\0';
        name[0xf] = '\0';
        name._0_8_ = pcVar15;
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>(poVar8,pcVar15,1);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar8,"image2DMS g_image_2dms;\nlayout(",0x1f);
        local_3d8 = 7;
        local_3d0._M_allocated_capacity = 0x69323361626772;
        local_3e0 = &local_3d0;
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>(poVar8,local_3d0._M_local_buf,7)
        ;
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,") readonly uniform ",0x13);
        draw_buffers._0_8_ = &local_310;
        local_310 = 'i';
        uStack_30f = 0;
        stack0xfffffffffffffce8 = 1;
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar8,(char *)draw_buffers._0_8_,1);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar8,
                   "image2DMSArray g_image_2dms_array;\nvoid main() {\n  o_color = vec4(0.0, 1.0, 0.0, 1.0);\n  ivec2 coord = ivec2(gl_FragCoord.xy);\n  if (imageLoad(g_image_2dms, coord, 0) != "
                   ,0xaa);
        textures = (GLuint  [2])&local_350;
        local_350 = 0x69;
        uStack_34f = 0;
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>(poVar8,(char *)textures,1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,"vec4",4);
        poVar8 = tcu::operator<<(poVar8,(Vector<int,_4> *)&local_3f0);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar8,
                   ") o_color = vec4(1.0, 0.0, 0.0, 0.1);\n  if (imageLoad(g_image_2dms, coord, 1) != "
                   ,0x51);
        _fbo = &local_330;
        local_330 = 'i';
        uStack_32f = 0;
        local_338 = 1;
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>(poVar8,_fbo,1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,"vec4",4);
        poVar8 = tcu::operator<<(poVar8,(Vector<int,_4> *)&local_3f0);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar8,
                   ") o_color = vec4(1.0, 0.0, 0.0, 0.1);\n  if (imageLoad(g_image_2dms, coord, 2) != "
                   ,0x51);
        _uniforms = &local_398;
        local_398 = 'i';
        uStack_397 = 0;
        local_3a0 = 1;
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>(poVar8,_uniforms,1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,"vec4",4);
        poVar8 = tcu::operator<<(poVar8,(Vector<int,_4> *)&local_3f0);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar8,
                   ") o_color = vec4(1.0, 0.0, 0.0, 0.1);\n  if (imageLoad(g_image_2dms, coord, 3) != "
                   ,0x51);
        local_200 = &local_1f0;
        local_1f0 = 'i';
        uStack_1ef = 0;
        local_1f8 = 1;
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>(poVar8,local_200,1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,"vec4",4);
        poVar8 = tcu::operator<<(poVar8,(Vector<int,_4> *)&local_3f0);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar8,
                   ") o_color = vec4(1.0, 0.0, 0.0, 0.1);\n  if (imageLoad(g_image_2dms_array, ivec3(coord, 0), 0) != "
                   ,0x61);
        local_220 = &local_210;
        local_210 = 'i';
        uStack_20f = 0;
        local_218 = 1;
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>(poVar8,local_220,1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,"vec4",4);
        poVar8 = tcu::operator<<(poVar8,(Vector<int,_4> *)&local_3f0);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar8,
                   ") o_color = vec4(1.0, 0.0, 0.0, 0.2);\n  if (imageLoad(g_image_2dms_array, ivec3(coord, 0), 1) != "
                   ,0x61);
        local_240 = &local_230;
        local_230 = 'i';
        uStack_22f = 0;
        local_238 = 1;
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>(poVar8,local_240,1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,"vec4",4);
        poVar8 = tcu::operator<<(poVar8,(Vector<int,_4> *)&local_3f0);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar8,
                   ") o_color = vec4(1.0, 0.0, 0.0, 0.2);\n  if (imageLoad(g_image_2dms_array, ivec3(coord, 0), 2) != "
                   ,0x61);
        local_260 = &local_250;
        local_250 = 'i';
        uStack_24f = 0;
        local_258 = 1;
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>(poVar8,local_260,1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,"vec4",4);
        poVar8 = tcu::operator<<(poVar8,(Vector<int,_4> *)&local_3f0);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar8,
                   ") o_color = vec4(1.0, 0.0, 0.0, 0.2);\n  if (imageLoad(g_image_2dms_array, ivec3(coord, 0), 3) != "
                   ,0x61);
        local_280 = &local_270;
        local_270 = 'i';
        uStack_26f = 0;
        local_278 = 1;
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>(poVar8,local_280,1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,"vec4",4);
        poVar8 = tcu::operator<<(poVar8,(Vector<int,_4> *)&local_3f0);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar8,
                   ") o_color = vec4(1.0, 0.0, 0.0, 0.2);\n  if (imageLoad(g_image_2dms_array, ivec3(coord, 1), 0) != "
                   ,0x61);
        local_2a0 = &local_290;
        local_290 = 'i';
        uStack_28f = 0;
        local_298 = 1;
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>(poVar8,local_2a0,1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,"vec4",4);
        poVar8 = tcu::operator<<(poVar8,(Vector<int,_4> *)&local_3f0);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar8,
                   ") o_color = vec4(1.0, 0.0, 0.0, 0.3);\n  if (imageLoad(g_image_2dms_array, ivec3(coord, 1), 1) != "
                   ,0x61);
        local_2c0 = &local_2b0;
        local_2b0 = 'i';
        uStack_2af = 0;
        local_2b8 = 1;
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>(poVar8,local_2c0,1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,"vec4",4);
        poVar8 = tcu::operator<<(poVar8,(Vector<int,_4> *)&local_3f0);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar8,
                   ") o_color = vec4(1.0, 0.0, 0.0, 0.3);\n  if (imageLoad(g_image_2dms_array, ivec3(coord, 1), 2) != "
                   ,0x61);
        local_2e0 = &local_2d0;
        local_2d0 = 'i';
        uStack_2cf = 0;
        local_2d8 = 1;
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>(poVar8,local_2e0,1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,"vec4",4);
        poVar8 = tcu::operator<<(poVar8,(Vector<int,_4> *)&local_3f0);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar8,
                   ") o_color = vec4(1.0, 0.0, 0.0, 0.3);\n  if (imageLoad(g_image_2dms_array, ivec3(coord, 1), 3) != "
                   ,0x61);
        local_300 = &local_2f0;
        local_2f0 = 'i';
        uStack_2ef = 0;
        local_2f8 = 1;
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>(poVar8,local_300,1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,"vec4",4);
        poVar8 = tcu::operator<<(poVar8,(Vector<int,_4> *)&local_3f0);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar8,") o_color = vec4(1.0, 0.0, 0.0, 0.3);\n}",0x27);
        if (local_300 != &local_2f0) {
          operator_delete(local_300,CONCAT62(uStack_2ee,CONCAT11(uStack_2ef,local_2f0)) + 1);
        }
        if (local_2e0 != &local_2d0) {
          operator_delete(local_2e0,CONCAT62(uStack_2ce,CONCAT11(uStack_2cf,local_2d0)) + 1);
        }
        if (local_2c0 != &local_2b0) {
          operator_delete(local_2c0,CONCAT62(uStack_2ae,CONCAT11(uStack_2af,local_2b0)) + 1);
        }
        if (local_2a0 != &local_290) {
          operator_delete(local_2a0,CONCAT62(uStack_28e,CONCAT11(uStack_28f,local_290)) + 1);
        }
        if (local_280 != &local_270) {
          operator_delete(local_280,CONCAT62(uStack_26e,CONCAT11(uStack_26f,local_270)) + 1);
        }
        if (local_260 != &local_250) {
          operator_delete(local_260,CONCAT62(uStack_24e,CONCAT11(uStack_24f,local_250)) + 1);
        }
        if (local_240 != &local_230) {
          operator_delete(local_240,CONCAT62(uStack_22e,CONCAT11(uStack_22f,local_230)) + 1);
        }
        if (local_220 != &local_210) {
          operator_delete(local_220,CONCAT62(uStack_20e,CONCAT11(uStack_20f,local_210)) + 1);
        }
        if (local_200 != &local_1f0) {
          operator_delete(local_200,CONCAT62(uStack_1ee,CONCAT11(uStack_1ef,local_1f0)) + 1);
        }
        if (_uniforms != &local_398) {
          operator_delete(_uniforms,CONCAT62(uStack_396,CONCAT11(uStack_397,local_398)) + 1);
        }
        if (_fbo != &local_330) {
          operator_delete(_fbo,CONCAT62(uStack_32e,CONCAT11(uStack_32f,local_330)) + 1);
        }
        if (textures != (GLuint  [2])&local_350) {
          operator_delete((void *)textures,CONCAT62(uStack_34e,CONCAT11(uStack_34f,local_350)) + 1);
        }
        if ((char *)draw_buffers._0_8_ != &local_310) {
          operator_delete((void *)draw_buffers._0_8_,
                          CONCAT62(uStack_30e,CONCAT11(uStack_30f,local_310)) + 1);
        }
        if (local_3e0 != &local_3d0) {
          operator_delete(local_3e0,local_3d0._M_allocated_capacity + 1);
        }
        if ((char *)name._0_8_ != pcVar15) {
          operator_delete((void *)name._0_8_,
                          CONCAT62(name._18_6_,CONCAT11(name[0x11],name[0x10])) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_418.first._M_dataplus._M_p != &local_418.first.field_2) {
          operator_delete(local_418.first._M_dataplus._M_p,
                          local_418.first.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::stringbuf::str();
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&name_index_map);
        std::ios_base::~ios_base(local_138);
        GVar6 = ShaderImageLoadStoreBase::BuildProgram
                          (&local_3b0->super_ShaderImageLoadStoreBase,
                           "#version 420 core\nlayout(location = 0) in vec4 i_position;\nvoid main() {\n  gl_Position = i_position;\n}"
                           ,(char *)0x0,(char *)0x0,(char *)0x0,(char *)local_1e0,(bool *)0x0);
        if (local_1e0 != local_1d0) {
          operator_delete(local_1e0,local_1d0[0] + 1);
        }
        pCVar1 = local_3b8;
        glu::CallLogWrapper::glGenTextures(local_3b8,2,textures);
        glu::CallLogWrapper::glBindTexture(pCVar1,0x9100,textures[0]);
        glu::CallLogWrapper::glTexImage2DMultisample(pCVar1,0x9100,4,0x8d82,0x10,0x10,'\0');
        glu::CallLogWrapper::glBindTexture(pCVar1,0x9100,0);
        glu::CallLogWrapper::glBindTexture(pCVar1,0x9102,textures[1]);
        glu::CallLogWrapper::glTexImage3DMultisample(pCVar1,0x9102,4,0x8d82,0x10,0x10,2,'\0');
        glu::CallLogWrapper::glBindTexture(pCVar1,0x9102,0);
        glu::CallLogWrapper::glGenFramebuffers(pCVar1,1,&fbo);
        glu::CallLogWrapper::glBindFramebuffer(pCVar1,0x8d40,fbo);
        glu::CallLogWrapper::glFramebufferTexture2D(pCVar1,0x8d40,0x8ce0,0x9100,textures[0],0);
        glu::CallLogWrapper::glFramebufferTextureLayer(pCVar1,0x8d40,0x8ce1,textures[1],0,0);
        glu::CallLogWrapper::glFramebufferTextureLayer(pCVar1,0x8d40,0x8ce2,textures[1],0,1);
        draw_buffers[0] = 0x8ce0;
        draw_buffers[1] = 0x8ce1;
        stack0xfffffffffffffce8 = CONCAT44(uStack_314,0x8ce2);
        glu::CallLogWrapper::glDrawBuffers(pCVar1,3,draw_buffers);
        glu::CallLogWrapper::glClearBufferiv(pCVar1,0x1800,0,(GLint *)local_1bc);
        glu::CallLogWrapper::glClearBufferiv(pCVar1,0x1800,1,(GLint *)local_1bc);
        glu::CallLogWrapper::glClearBufferiv(pCVar1,0x1800,2,(GLint *)local_1bc);
        glu::CallLogWrapper::glDeleteFramebuffers(pCVar1,1,&fbo);
        glu::CallLogWrapper::glBindImageTexture(pCVar1,1,textures[0],0,'\0',0,35000,0x8d82);
        pvVar14 = (vec4 *)0x0;
        glu::CallLogWrapper::glBindImageTexture(pCVar1,4,textures[1],0,'\x01',0,35000,0x8d82);
        glu::CallLogWrapper::glUseProgram(pCVar1,GVar6);
        GVar7 = glu::CallLogWrapper::glGetUniformLocation(pCVar1,GVar6,"g_image_2dms");
        glu::CallLogWrapper::glUniform1i(pCVar1,GVar7,1);
        GVar7 = glu::CallLogWrapper::glGetUniformLocation(pCVar1,GVar6,"g_image_2dms_array");
        glu::CallLogWrapper::glUniform1i(pCVar1,GVar7,4);
        glu::CallLogWrapper::glClear(pCVar1,0x4000);
        pBVar3 = local_3b0;
        glu::CallLogWrapper::glBindVertexArray(pCVar1,local_3b0->m_vao);
        iVar12 = 0x10;
        glu::CallLogWrapper::glViewport(pCVar1,0,0,0x10,0x10);
        glu::CallLogWrapper::glDrawArrays(pCVar1,5,0,4);
        name_index_map._M_t._M_impl._0_8_ = 0x3f80000000000000;
        name_index_map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        name_index_map._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0x3f800000;
        bVar4 = ShaderImageLoadStoreBase::ValidateReadBuffer
                          (&pBVar3->super_ShaderImageLoadStoreBase,0x10,0x10,(int)&name_index_map,
                           iVar12,pvVar14);
        GVar13 = (GLenum)pvVar14;
        local_3bc = (undefined4)CONCAT71(extraout_var_00,bVar4);
        name_index_map._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
             name_index_map._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffff00000000;
        name_index_map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        name_index_map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
             &name_index_map._M_t._M_impl.super__Rb_tree_header._M_header;
        name_index_map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
        name_index_map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
             name_index_map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        glu::CallLogWrapper::glGetProgramiv(pCVar1,GVar6,0x8b86,&uniforms);
        if (uniforms != 2) {
          local_3bc = 0;
          anon_unknown_0::Output("ACTIVE_UNIFORMS is %d should be 2.\n");
        }
        if (uniforms != 0) {
          GVar16 = 0;
          do {
            pcVar15 = name;
            glu::CallLogWrapper::glGetActiveUniformName
                      (local_3b8,GVar6,GVar16,0x20,(GLsizei *)0x0,name);
            GVar13 = (GLenum)pcVar15;
            local_3e0 = &local_3d0;
            sVar9 = strlen(name);
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_3e0,name,name + sVar9);
            local_418.first._M_dataplus._M_p = (pointer)&local_418.first.field_2;
            if (local_3e0 == &local_3d0) {
              local_418.first.field_2._8_8_ = CONCAT71(local_3d0._9_7_,local_3d0._M_local_buf[8]);
            }
            else {
              local_418.first._M_dataplus._M_p = (pointer)local_3e0;
            }
            local_418.first.field_2._M_allocated_capacity = local_3d0._M_allocated_capacity;
            local_418.first._M_string_length = local_3d8;
            local_3d8 = 0;
            local_3d0._M_allocated_capacity = local_3d0._M_allocated_capacity & 0xffffffffffffff00;
            local_418.second = GVar16;
            local_3e0 = &local_3d0;
            std::
            _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_int>,std::_Select1st<std::pair<std::__cxx11::string_const,unsigned_int>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_int>>>
            ::_M_emplace_unique<std::pair<std::__cxx11::string,unsigned_int>>
                      ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_int>,std::_Select1st<std::pair<std::__cxx11::string_const,unsigned_int>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_int>>>
                        *)&name_index_map,&local_418);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_418.first._M_dataplus._M_p != &local_418.first.field_2) {
              operator_delete(local_418.first._M_dataplus._M_p,
                              local_418.first.field_2._M_allocated_capacity + 1);
            }
            if (local_3e0 != &local_3d0) {
              operator_delete(local_3e0,local_3d0._M_allocated_capacity + 1);
            }
            GVar16 = GVar16 + 1;
          } while (GVar16 < (uint)uniforms);
        }
        paVar2 = &local_418.first.field_2;
        local_418.first.field_2._M_allocated_capacity = 0x5f6567616d695f67;
        local_418.first._M_string_length = 0xc;
        local_418.first.field_2._8_5_ = 0x736d6432;
        local_418.first._M_dataplus._M_p = (pointer)paVar2;
        bVar4 = ShaderImageLoadStoreBase::CheckUniform
                          (&local_3b0->super_ShaderImageLoadStoreBase,GVar6,&local_418.first,
                           &name_index_map,0x9060,GVar13);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_418.first._M_dataplus._M_p != paVar2) {
          operator_delete(local_418.first._M_dataplus._M_p,
                          local_418.first.field_2._M_allocated_capacity + 1);
        }
        local_418.first._M_dataplus._M_p = (pointer)&local_418.first.field_2;
        name[0] = '\x12';
        name[1] = '\0';
        name[2] = '\0';
        name[3] = '\0';
        name[4] = '\0';
        name[5] = '\0';
        name[6] = '\0';
        name[7] = '\0';
        local_418.first._M_dataplus._M_p =
             (pointer)std::__cxx11::string::_M_create((ulong *)&local_418,(ulong)name);
        local_418.first.field_2._M_local_buf[0] = name[0];
        local_418.first.field_2._M_local_buf[1] = name[1];
        local_418.first.field_2._M_local_buf[2] = name[2];
        local_418.first.field_2._M_local_buf[3] = name[3];
        local_418.first.field_2._M_local_buf[4] = name[4];
        local_418.first.field_2._M_local_buf[5] = name[5];
        local_418.first.field_2._M_local_buf[6] = name[6];
        local_418.first.field_2._M_local_buf[7] = name[7];
        builtin_strncpy(local_418.first._M_dataplus._M_p,"g_image_2dms_array",0x12);
        local_418.first._M_string_length._0_1_ = name[0];
        local_418.first._M_string_length._1_1_ = name[1];
        local_418.first._M_string_length._2_1_ = name[2];
        local_418.first._M_string_length._3_1_ = name[3];
        local_418.first._M_string_length._4_1_ = name[4];
        local_418.first._M_string_length._5_1_ = name[5];
        local_418.first._M_string_length._6_1_ = name[6];
        local_418.first._M_string_length._7_1_ = name[7];
        local_418.first._M_dataplus._M_p[name._0_8_] = '\0';
        bVar5 = ShaderImageLoadStoreBase::CheckUniform
                          (&local_3b0->super_ShaderImageLoadStoreBase,GVar6,&local_418.first,
                           &name_index_map,0x9061,GVar13);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_418.first._M_dataplus._M_p != &local_418.first.field_2) {
          operator_delete(local_418.first._M_dataplus._M_p,
                          local_418.first.field_2._M_allocated_capacity + 1);
        }
        glu::CallLogWrapper::glDeleteTextures(local_3b8,2,textures);
        glu::CallLogWrapper::glUseProgram(local_3b8,0);
        glu::CallLogWrapper::glDeleteProgram(local_3b8,GVar6);
        bVar11 = (byte)local_3bc;
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
        ::~_Rb_tree(&name_index_map._M_t);
        if ((bVar11 & bVar4 & bVar5) != 1) {
          return -1;
        }
        local_1bc[0] = 1.4013e-45;
        local_1bc[1] = 2.8026e-45;
        aDStack_1b4[0] = TYPE_FLOAT_VEC3;
        aDStack_1b4[1] = TYPE_FLOAT_VEC4;
        local_3f0.m_data[0] = 1.4013e-45;
        local_3f0.m_data[1] = 2.8026e-45;
        local_3f0.m_data[2] = 4.2039e-45;
        local_3f0.m_data[3] = 5.60519e-45;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&name_index_map);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&name_index_map,
                   "#version 420 core\nlayout(location = 0) out vec4 o_color;\nlayout(",0x40);
        local_418.first._M_dataplus._M_p = (pointer)&local_418.first.field_2;
        local_418.first.field_2._M_allocated_capacity = 0x6975323361626772;
        local_418.first._M_string_length = 8;
        local_418.first.field_2._8_8_ = local_418.first.field_2._8_8_ & 0xffffffffffffff00;
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&name_index_map,local_418.first._M_dataplus._M_p,8);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,") readonly uniform ",0x13);
        name._0_8_ = name + 0x10;
        name[0x10] = 'u';
        name[0x11] = '\0';
        name[8] = '\x01';
        name[9] = '\0';
        name[10] = '\0';
        name[0xb] = '\0';
        name[0xc] = '\0';
        name[0xd] = '\0';
        name[0xe] = '\0';
        name[0xf] = '\0';
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>(poVar8,(char *)name._0_8_,1);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar8,"image2DMS g_image_2dms;\nlayout(",0x1f);
        local_3d0._M_allocated_capacity = 0x6975323361626772;
        local_3d8 = 8;
        local_3d0._M_local_buf[8] = '\0';
        local_3e0 = &local_3d0;
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>(poVar8,local_3d0._M_local_buf,8)
        ;
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,") readonly uniform ",0x13);
        draw_buffers._0_8_ = &local_310;
        local_310 = 'u';
        uStack_30f = 0;
        stack0xfffffffffffffce8 = 1;
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar8,(char *)draw_buffers._0_8_,1);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar8,
                   "image2DMSArray g_image_2dms_array;\nvoid main() {\n  o_color = vec4(0.0, 1.0, 0.0, 1.0);\n  ivec2 coord = ivec2(gl_FragCoord.xy);\n  if (imageLoad(g_image_2dms, coord, 0) != "
                   ,0xaa);
        textures = (GLuint  [2])&local_350;
        local_350 = 0x75;
        uStack_34f = 0;
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>(poVar8,(char *)textures,1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,"vec4",4);
        poVar8 = tcu::operator<<(poVar8,(Vector<unsigned_int,_4> *)&local_3f0);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar8,
                   ") o_color = vec4(1.0, 0.0, 0.0, 0.1);\n  if (imageLoad(g_image_2dms, coord, 1) != "
                   ,0x51);
        _fbo = &local_330;
        local_330 = 'u';
        uStack_32f = 0;
        local_338 = 1;
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>(poVar8,_fbo,1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,"vec4",4);
        poVar8 = tcu::operator<<(poVar8,(Vector<unsigned_int,_4> *)&local_3f0);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar8,
                   ") o_color = vec4(1.0, 0.0, 0.0, 0.1);\n  if (imageLoad(g_image_2dms, coord, 2) != "
                   ,0x51);
        _uniforms = &local_398;
        local_398 = 'u';
        uStack_397 = 0;
        local_3a0 = 1;
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>(poVar8,_uniforms,1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,"vec4",4);
        poVar8 = tcu::operator<<(poVar8,(Vector<unsigned_int,_4> *)&local_3f0);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar8,
                   ") o_color = vec4(1.0, 0.0, 0.0, 0.1);\n  if (imageLoad(g_image_2dms, coord, 3) != "
                   ,0x51);
        local_200 = &local_1f0;
        local_1f0 = 'u';
        uStack_1ef = 0;
        local_1f8 = 1;
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>(poVar8,local_200,1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,"vec4",4);
        poVar8 = tcu::operator<<(poVar8,(Vector<unsigned_int,_4> *)&local_3f0);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar8,
                   ") o_color = vec4(1.0, 0.0, 0.0, 0.1);\n  if (imageLoad(g_image_2dms_array, ivec3(coord, 0), 0) != "
                   ,0x61);
        local_220 = &local_210;
        local_210 = 'u';
        uStack_20f = 0;
        local_218 = 1;
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>(poVar8,local_220,1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,"vec4",4);
        poVar8 = tcu::operator<<(poVar8,(Vector<unsigned_int,_4> *)&local_3f0);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar8,
                   ") o_color = vec4(1.0, 0.0, 0.0, 0.2);\n  if (imageLoad(g_image_2dms_array, ivec3(coord, 0), 1) != "
                   ,0x61);
        local_240 = &local_230;
        local_230 = 'u';
        uStack_22f = 0;
        local_238 = 1;
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>(poVar8,local_240,1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,"vec4",4);
        poVar8 = tcu::operator<<(poVar8,(Vector<unsigned_int,_4> *)&local_3f0);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar8,
                   ") o_color = vec4(1.0, 0.0, 0.0, 0.2);\n  if (imageLoad(g_image_2dms_array, ivec3(coord, 0), 2) != "
                   ,0x61);
        local_260 = &local_250;
        local_250 = 'u';
        uStack_24f = 0;
        local_258 = 1;
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>(poVar8,local_260,1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,"vec4",4);
        poVar8 = tcu::operator<<(poVar8,(Vector<unsigned_int,_4> *)&local_3f0);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar8,
                   ") o_color = vec4(1.0, 0.0, 0.0, 0.2);\n  if (imageLoad(g_image_2dms_array, ivec3(coord, 0), 3) != "
                   ,0x61);
        local_280 = &local_270;
        local_270 = 'u';
        uStack_26f = 0;
        local_278 = 1;
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>(poVar8,local_280,1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,"vec4",4);
        poVar8 = tcu::operator<<(poVar8,(Vector<unsigned_int,_4> *)&local_3f0);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar8,
                   ") o_color = vec4(1.0, 0.0, 0.0, 0.2);\n  if (imageLoad(g_image_2dms_array, ivec3(coord, 1), 0) != "
                   ,0x61);
        local_2a0 = &local_290;
        local_290 = 'u';
        uStack_28f = 0;
        local_298 = 1;
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>(poVar8,local_2a0,1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,"vec4",4);
        poVar8 = tcu::operator<<(poVar8,(Vector<unsigned_int,_4> *)&local_3f0);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar8,
                   ") o_color = vec4(1.0, 0.0, 0.0, 0.3);\n  if (imageLoad(g_image_2dms_array, ivec3(coord, 1), 1) != "
                   ,0x61);
        local_2c0 = &local_2b0;
        local_2b0 = 'u';
        uStack_2af = 0;
        local_2b8 = 1;
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>(poVar8,local_2c0,1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,"vec4",4);
        poVar8 = tcu::operator<<(poVar8,(Vector<unsigned_int,_4> *)&local_3f0);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar8,
                   ") o_color = vec4(1.0, 0.0, 0.0, 0.3);\n  if (imageLoad(g_image_2dms_array, ivec3(coord, 1), 2) != "
                   ,0x61);
        local_2e0 = &local_2d0;
        local_2d0 = 'u';
        uStack_2cf = 0;
        local_2d8 = 1;
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>(poVar8,local_2e0,1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,"vec4",4);
        poVar8 = tcu::operator<<(poVar8,(Vector<unsigned_int,_4> *)&local_3f0);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar8,
                   ") o_color = vec4(1.0, 0.0, 0.0, 0.3);\n  if (imageLoad(g_image_2dms_array, ivec3(coord, 1), 3) != "
                   ,0x61);
        local_300 = &local_2f0;
        local_2f0 = 'u';
        uStack_2ef = 0;
        local_2f8 = 1;
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>(poVar8,local_300,1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,"vec4",4);
        poVar8 = tcu::operator<<(poVar8,(Vector<unsigned_int,_4> *)&local_3f0);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar8,") o_color = vec4(1.0, 0.0, 0.0, 0.3);\n}",0x27);
        if (local_300 != &local_2f0) {
          operator_delete(local_300,CONCAT62(uStack_2ee,CONCAT11(uStack_2ef,local_2f0)) + 1);
        }
        if (local_2e0 != &local_2d0) {
          operator_delete(local_2e0,CONCAT62(uStack_2ce,CONCAT11(uStack_2cf,local_2d0)) + 1);
        }
        if (local_2c0 != &local_2b0) {
          operator_delete(local_2c0,CONCAT62(uStack_2ae,CONCAT11(uStack_2af,local_2b0)) + 1);
        }
        if (local_2a0 != &local_290) {
          operator_delete(local_2a0,CONCAT62(uStack_28e,CONCAT11(uStack_28f,local_290)) + 1);
        }
        if (local_280 != &local_270) {
          operator_delete(local_280,CONCAT62(uStack_26e,CONCAT11(uStack_26f,local_270)) + 1);
        }
        if (local_260 != &local_250) {
          operator_delete(local_260,CONCAT62(uStack_24e,CONCAT11(uStack_24f,local_250)) + 1);
        }
        if (local_240 != &local_230) {
          operator_delete(local_240,CONCAT62(uStack_22e,CONCAT11(uStack_22f,local_230)) + 1);
        }
        if (local_220 != &local_210) {
          operator_delete(local_220,CONCAT62(uStack_20e,CONCAT11(uStack_20f,local_210)) + 1);
        }
        if (local_200 != &local_1f0) {
          operator_delete(local_200,CONCAT62(uStack_1ee,CONCAT11(uStack_1ef,local_1f0)) + 1);
        }
        if (_uniforms != &local_398) {
          operator_delete(_uniforms,CONCAT62(uStack_396,CONCAT11(uStack_397,local_398)) + 1);
        }
        if (_fbo != &local_330) {
          operator_delete(_fbo,CONCAT62(uStack_32e,CONCAT11(uStack_32f,local_330)) + 1);
        }
        if (textures != (GLuint  [2])&local_350) {
          operator_delete((void *)textures,CONCAT62(uStack_34e,CONCAT11(uStack_34f,local_350)) + 1);
        }
        if ((char *)draw_buffers._0_8_ != &local_310) {
          operator_delete((void *)draw_buffers._0_8_,
                          CONCAT62(uStack_30e,CONCAT11(uStack_30f,local_310)) + 1);
        }
        if (local_3e0 != &local_3d0) {
          operator_delete(local_3e0,local_3d0._M_allocated_capacity + 1);
        }
        if ((GLchar *)name._0_8_ != name + 0x10) {
          operator_delete((void *)name._0_8_,
                          CONCAT62(name._18_6_,CONCAT11(name[0x11],name[0x10])) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_418.first._M_dataplus._M_p != &local_418.first.field_2) {
          operator_delete(local_418.first._M_dataplus._M_p,
                          local_418.first.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::stringbuf::str();
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&name_index_map);
        std::ios_base::~ios_base(local_138);
        GVar6 = ShaderImageLoadStoreBase::BuildProgram
                          (&local_3b0->super_ShaderImageLoadStoreBase,
                           "#version 420 core\nlayout(location = 0) in vec4 i_position;\nvoid main() {\n  gl_Position = i_position;\n}"
                           ,(char *)0x0,(char *)0x0,(char *)0x0,(char *)local_1e0,(bool *)0x0);
        if (local_1e0 != local_1d0) {
          operator_delete(local_1e0,local_1d0[0] + 1);
        }
        pCVar1 = local_3b8;
        glu::CallLogWrapper::glGenTextures(local_3b8,2,textures);
        glu::CallLogWrapper::glBindTexture(pCVar1,0x9100,textures[0]);
        glu::CallLogWrapper::glTexImage2DMultisample(pCVar1,0x9100,4,0x8d70,0x10,0x10,'\0');
        glu::CallLogWrapper::glBindTexture(pCVar1,0x9100,0);
        glu::CallLogWrapper::glBindTexture(pCVar1,0x9102,textures[1]);
        glu::CallLogWrapper::glTexImage3DMultisample(pCVar1,0x9102,4,0x8d70,0x10,0x10,2,'\0');
        glu::CallLogWrapper::glBindTexture(pCVar1,0x9102,0);
        glu::CallLogWrapper::glGenFramebuffers(pCVar1,1,&fbo);
        glu::CallLogWrapper::glBindFramebuffer(pCVar1,0x8d40,fbo);
        glu::CallLogWrapper::glFramebufferTexture2D(pCVar1,0x8d40,0x8ce0,0x9100,textures[0],0);
        glu::CallLogWrapper::glFramebufferTextureLayer(pCVar1,0x8d40,0x8ce1,textures[1],0,0);
        glu::CallLogWrapper::glFramebufferTextureLayer(pCVar1,0x8d40,0x8ce2,textures[1],0,1);
        draw_buffers[0] = 0x8ce0;
        draw_buffers[1] = 0x8ce1;
        stack0xfffffffffffffce8 = CONCAT44(uStack_314,0x8ce2);
        glu::CallLogWrapper::glDrawBuffers(pCVar1,3,draw_buffers);
        glu::CallLogWrapper::glClearBufferuiv(pCVar1,0x1800,0,(GLuint *)local_1bc);
        glu::CallLogWrapper::glClearBufferuiv(pCVar1,0x1800,1,(GLuint *)local_1bc);
        glu::CallLogWrapper::glClearBufferuiv(pCVar1,0x1800,2,(GLuint *)local_1bc);
        glu::CallLogWrapper::glDeleteFramebuffers(pCVar1,1,&fbo);
        glu::CallLogWrapper::glBindImageTexture(pCVar1,1,textures[0],0,'\0',0,35000,0x8d70);
        pvVar14 = (vec4 *)0x0;
        glu::CallLogWrapper::glBindImageTexture(pCVar1,4,textures[1],0,'\x01',0,35000,0x8d70);
        glu::CallLogWrapper::glUseProgram(pCVar1,GVar6);
        GVar7 = glu::CallLogWrapper::glGetUniformLocation(pCVar1,GVar6,"g_image_2dms");
        glu::CallLogWrapper::glUniform1i(pCVar1,GVar7,1);
        GVar7 = glu::CallLogWrapper::glGetUniformLocation(pCVar1,GVar6,"g_image_2dms_array");
        glu::CallLogWrapper::glUniform1i(pCVar1,GVar7,4);
        glu::CallLogWrapper::glClear(pCVar1,0x4000);
        pBVar3 = local_3b0;
        glu::CallLogWrapper::glBindVertexArray(pCVar1,local_3b0->m_vao);
        iVar12 = 0x10;
        glu::CallLogWrapper::glViewport(pCVar1,0,0,0x10,0x10);
        glu::CallLogWrapper::glDrawArrays(pCVar1,5,0,4);
        name_index_map._M_t._M_impl._0_8_ = 0x3f80000000000000;
        name_index_map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        name_index_map._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0x3f800000;
        bVar4 = ShaderImageLoadStoreBase::ValidateReadBuffer
                          (&pBVar3->super_ShaderImageLoadStoreBase,0x10,0x10,(int)&name_index_map,
                           iVar12,pvVar14);
        GVar13 = (GLenum)pvVar14;
        local_3bc = (undefined4)CONCAT71(extraout_var_01,bVar4);
        name_index_map._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
             name_index_map._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffff00000000;
        name_index_map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        name_index_map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
             &name_index_map._M_t._M_impl.super__Rb_tree_header._M_header;
        name_index_map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
        name_index_map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
             name_index_map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        glu::CallLogWrapper::glGetProgramiv(pCVar1,GVar6,0x8b86,&uniforms);
        if (uniforms != 2) {
          local_3bc = 0;
          anon_unknown_0::Output("ACTIVE_UNIFORMS is %d should be 2.\n");
        }
        if (uniforms != 0) {
          GVar16 = 0;
          do {
            pcVar15 = name;
            glu::CallLogWrapper::glGetActiveUniformName
                      (local_3b8,GVar6,GVar16,0x20,(GLsizei *)0x0,name);
            GVar13 = (GLenum)pcVar15;
            local_3e0 = &local_3d0;
            sVar9 = strlen(name);
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_3e0,name,name + sVar9);
            local_418.first._M_dataplus._M_p = (pointer)&local_418.first.field_2;
            if (local_3e0 == &local_3d0) {
              local_418.first.field_2._8_8_ = CONCAT71(local_3d0._9_7_,local_3d0._M_local_buf[8]);
            }
            else {
              local_418.first._M_dataplus._M_p = (pointer)local_3e0;
            }
            local_418.first.field_2._M_allocated_capacity = local_3d0._M_allocated_capacity;
            local_418.first._M_string_length = local_3d8;
            local_3d8 = 0;
            local_3d0._M_allocated_capacity = local_3d0._M_allocated_capacity & 0xffffffffffffff00;
            local_418.second = GVar16;
            local_3e0 = &local_3d0;
            std::
            _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_int>,std::_Select1st<std::pair<std::__cxx11::string_const,unsigned_int>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_int>>>
            ::_M_emplace_unique<std::pair<std::__cxx11::string,unsigned_int>>
                      ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_int>,std::_Select1st<std::pair<std::__cxx11::string_const,unsigned_int>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_int>>>
                        *)&name_index_map,&local_418);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_418.first._M_dataplus._M_p != &local_418.first.field_2) {
              operator_delete(local_418.first._M_dataplus._M_p,
                              local_418.first.field_2._M_allocated_capacity + 1);
            }
            if (local_3e0 != &local_3d0) {
              operator_delete(local_3e0,local_3d0._M_allocated_capacity + 1);
            }
            GVar16 = GVar16 + 1;
          } while (GVar16 < (uint)uniforms);
        }
        paVar2 = &local_418.first.field_2;
        local_418.first.field_2._M_allocated_capacity = 0x5f6567616d695f67;
        local_418.first._M_string_length = 0xc;
        local_418.first.field_2._8_5_ = 0x736d6432;
        local_418.first._M_dataplus._M_p = (pointer)paVar2;
        bVar4 = ShaderImageLoadStoreBase::CheckUniform
                          (&local_3b0->super_ShaderImageLoadStoreBase,GVar6,&local_418.first,
                           &name_index_map,0x906b,GVar13);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_418.first._M_dataplus._M_p != paVar2) {
          operator_delete(local_418.first._M_dataplus._M_p,
                          local_418.first.field_2._M_allocated_capacity + 1);
        }
        local_418.first._M_dataplus._M_p = (pointer)&local_418.first.field_2;
        name[0] = '\x12';
        name[1] = '\0';
        name[2] = '\0';
        name[3] = '\0';
        name[4] = '\0';
        name[5] = '\0';
        name[6] = '\0';
        name[7] = '\0';
        local_418.first._M_dataplus._M_p =
             (pointer)std::__cxx11::string::_M_create((ulong *)&local_418,(ulong)name);
        local_418.first.field_2._M_local_buf[0] = name[0];
        local_418.first.field_2._M_local_buf[1] = name[1];
        local_418.first.field_2._M_local_buf[2] = name[2];
        local_418.first.field_2._M_local_buf[3] = name[3];
        local_418.first.field_2._M_local_buf[4] = name[4];
        local_418.first.field_2._M_local_buf[5] = name[5];
        local_418.first.field_2._M_local_buf[6] = name[6];
        local_418.first.field_2._M_local_buf[7] = name[7];
        builtin_strncpy(local_418.first._M_dataplus._M_p,"g_image_2dms_array",0x12);
        local_418.first._M_string_length._0_1_ = name[0];
        local_418.first._M_string_length._1_1_ = name[1];
        local_418.first._M_string_length._2_1_ = name[2];
        local_418.first._M_string_length._3_1_ = name[3];
        local_418.first._M_string_length._4_1_ = name[4];
        local_418.first._M_string_length._5_1_ = name[5];
        local_418.first._M_string_length._6_1_ = name[6];
        local_418.first._M_string_length._7_1_ = name[7];
        local_418.first._M_dataplus._M_p[name._0_8_] = '\0';
        bVar5 = ShaderImageLoadStoreBase::CheckUniform
                          (&local_3b0->super_ShaderImageLoadStoreBase,GVar6,&local_418.first,
                           &name_index_map,0x906c,GVar13);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_418.first._M_dataplus._M_p != &local_418.first.field_2) {
          operator_delete(local_418.first._M_dataplus._M_p,
                          local_418.first.field_2._M_allocated_capacity + 1);
        }
        glu::CallLogWrapper::glDeleteTextures(local_3b8,2,textures);
        glu::CallLogWrapper::glUseProgram(local_3b8,0);
        glu::CallLogWrapper::glDeleteProgram(local_3b8,GVar6);
        bVar11 = (byte)local_3bc;
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
        ::~_Rb_tree(&name_index_map._M_t);
        if ((bVar11 & bVar4 & bVar5) != 1) {
          return -1;
        }
      }
      lVar10 = 0;
    }
  }
  return lVar10;
}

Assistant:

virtual long Run()
	{
		if (!SupportedSamples(4))
			return NOT_SUPPORTED;

		CreateFullViewportQuad(&m_vao, &m_vbo, NULL);

		if (!ReadMS(GL_RGBA32F, vec4(-1.0f, 10.0f, -200.0f, 3000.0f), vec4(-1.0f, 10.0f, -200.0f, 3000.0f)))
			return ERROR;

		GLint isamples;
		glGetIntegerv(GL_MAX_INTEGER_SAMPLES, &isamples);
		if (isamples >= 4)
		{
			if (!ReadMS(GL_RGBA32I, ivec4(1, -2, 3, -4), ivec4(1, -2, 3, -4)))
				return ERROR;
			if (!ReadMS(GL_RGBA32UI, uvec4(1, 2, 3, 4), uvec4(1, 2, 3, 4)))
				return ERROR;
		}

		return NO_ERROR;
	}